

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::Textures::StorageAndSubImageTest::
LoopTestOverS<unsigned_char,true,3u,false>(StorageAndSubImageTest *this,bool skip_rgb)

{
  bool bVar1;
  bool bVar2;
  undefined7 in_register_00000031;
  
  PrepareProgram(this,s_fragment_shader_3D_fdecl_highp,s_fragment_shader_3D_tail);
  bVar1 = Test<unsigned_char,1,true,3u,false>(this);
  bVar2 = Test<unsigned_char,2,true,3u,false>(this);
  bVar2 = bVar2 && bVar1;
  if ((int)CONCAT71(in_register_00000031,skip_rgb) == 0) {
    bVar1 = Test<unsigned_char,3,true,3u,false>(this);
    bVar2 = bVar2 && bVar1;
  }
  bVar1 = Test<unsigned_char,4,true,3u,false>(this);
  CleanProgram(this);
  CleanErrors(this);
  return (bool)(bVar1 & bVar2);
}

Assistant:

bool StorageAndSubImageTest::LoopTestOverS(bool skip_rgb)
{
	/* Prepare one program per test loop. */
	PrepareProgram(FragmentShaderDeclaration<T, N, D>(), FragmentShaderTail<D>());

	/* Run tests. */
	bool result = true;

	result &= Test<T, 1, N, D, I>();

	result &= Test<T, 2, N, D, I>();

	if (!skip_rgb)
	{
		result &= Test<T, 3, N, D, I>();
	}

	result &= Test<T, 4, N, D, I>();

	/* Cleanup.*/
	CleanProgram();
	CleanErrors();

	/* Pass result. */
	return result;
}